

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_value.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::ArrayValueBind
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  __uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_> _Var1;
  reference pvVar2;
  pointer pEVar3;
  ulong uVar4;
  InvalidInputException *this_00;
  OutOfRangeException *this_01;
  idx_t i;
  ulong __n;
  LogicalType *this_02;
  allocator local_79;
  string local_78;
  __uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_> local_58;
  optional_idx local_50;
  LogicalType child_type;
  
  local_58._M_t.
  super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
  super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl =
       (tuple<duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)
       (tuple<duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)this;
  if ((arguments->
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (arguments->
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_78,"array_value requires at least one argument",
               (allocator *)&child_type);
    InvalidInputException::InvalidInputException(this_00,&local_78);
    __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pvVar2 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(arguments,0);
  pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar2);
  LogicalType::LogicalType(&child_type,&pEVar3->return_type);
  for (__n = 1; uVar4 = (long)(arguments->
                              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                              ).
                              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(arguments->
                              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                              ).
                              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3, __n < uVar4;
      __n = __n + 1) {
    pvVar2 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(arguments,__n);
    pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar2);
    LogicalType::MaxLogicalType((LogicalType *)&local_78,context,&child_type,&pEVar3->return_type);
    LogicalType::operator=(&child_type,(LogicalType *)&local_78);
    LogicalType::~LogicalType((LogicalType *)&local_78);
  }
  if (uVar4 < 0x186a1) {
    LogicalType::operator=
              (&(bound_function->super_BaseScalarFunction).super_SimpleFunction.varargs,&child_type)
    ;
    optional_idx::optional_idx
              (&local_50,
               (long)(arguments->
                     super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     ).
                     super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(arguments->
                     super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     ).
                     super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3);
    LogicalType::ARRAY((LogicalType *)&local_78,&child_type,local_50);
    this_02 = &(bound_function->super_BaseScalarFunction).return_type;
    LogicalType::operator=(this_02,(LogicalType *)&local_78);
    LogicalType::~LogicalType((LogicalType *)&local_78);
    make_uniq<duckdb::VariableReturnBindData,duckdb::LogicalType&>((duckdb *)&local_78,this_02);
    _Var1._M_t.
    super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
    super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl =
         local_58._M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
         super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
    *(pointer *)
     local_58._M_t.
     super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
     super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl = local_78._M_dataplus._M_p;
    LogicalType::~LogicalType(&child_type);
    return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
           (_Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)
           _Var1._M_t.
           super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
           .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
  }
  this_01 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_78,"Array size exceeds maximum allowed size",&local_79);
  OutOfRangeException::OutOfRangeException(this_01,&local_78);
  __cxa_throw(this_01,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static unique_ptr<FunctionData> ArrayValueBind(ClientContext &context, ScalarFunction &bound_function,
                                               vector<unique_ptr<Expression>> &arguments) {
	if (arguments.empty()) {
		throw InvalidInputException("array_value requires at least one argument");
	}

	// construct return type
	LogicalType child_type = arguments[0]->return_type;
	for (idx_t i = 1; i < arguments.size(); i++) {
		child_type = LogicalType::MaxLogicalType(context, child_type, arguments[i]->return_type);
	}

	if (arguments.size() > ArrayType::MAX_ARRAY_SIZE) {
		throw OutOfRangeException("Array size exceeds maximum allowed size");
	}

	// this is more for completeness reasons
	bound_function.varargs = child_type;
	bound_function.return_type = LogicalType::ARRAY(child_type, arguments.size());
	return make_uniq<VariableReturnBindData>(bound_function.return_type);
}